

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::FreezeImpl
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,bool isConvertedType)

{
  byte bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar5;
  
  bVar1 = (this->super_DynamicTypeHandler).flags;
  if ((char)bVar1 < '\0') {
    return 1;
  }
  if ((bVar1 & 4) == 0) {
    bVar2 = DynamicObject::HasObjectArray(instance);
    if (!bVar2) {
      BVar4 = FreezeInternal(this,instance,isConvertedType);
      return BVar4;
    }
  }
  pDVar5 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(pDVar5,instance,0,UNRECOVERED_JUMPTABLE);
  return iVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        if (IsNotExtensibleSupported)
        {
            if (this->GetFlags() & IsFrozenOnceFlag)
            {
                // Already frozen => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked() && !instance->HasObjectArray())
            {
                // If there is object array, we need to convert both type handler and array to ES5.
                // Otherwise, if the type is not shared with others, we can just change it by itself.
                // If the type is not shared with others, we can just change it by itself.
                return FreezeInternal(instance, isConvertedType);
            }
        }

        return ConvertToDictionaryType(instance)->Freeze(instance);
    }